

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O0

void __thiscall TestMeter::~TestMeter(TestMeter *this)

{
  TestMetrics *in_RDI;
  int i;
  Meter *in_stack_ffffffffffffffd0;
  void *pvVar1;
  int local_c;
  
  pvVar1 = (void *)in_RDI->predictedGold;
  if (pvVar1 != (void *)0x0) {
    fasttext::Meter::~Meter(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1,0x78);
  }
  pvVar1 = *(void **)&in_RDI->scoresLen;
  if (pvVar1 != (void *)0x0) {
    TestMetrics::~TestMetrics(in_RDI);
    operator_delete(pvVar1,0x30);
  }
  for (local_c = 0; (ulong)(long)local_c < in_RDI->predicted; local_c = local_c + 1) {
    if ((*(long *)(in_RDI->predictedScores + (long)local_c * 2) != 0) &&
       (pvVar1 = *(void **)(in_RDI->predictedScores + (long)local_c * 2), pvVar1 != (void *)0x0)) {
      TestMetrics::~TestMetrics(in_RDI);
      operator_delete(pvVar1,0x30);
    }
  }
  if (in_RDI->predictedScores != (float *)0x0) {
    operator_delete__(in_RDI->predictedScores);
  }
  return;
}

Assistant:

~TestMeter()
    {
        delete sourceMeter;
        delete metrics;

        for (int i = 0; i<nlabels; ++i)
        {
            if (labelMetrics[i] != nullptr)
            {
                delete labelMetrics[i];
            }
        }

        delete[] labelMetrics;
    }